

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::fill<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,
          FixedArray<char,_1UL> *rest,StringTree *rest_1,FixedArray<char,_1UL> *rest_2)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  FixedArray<char,_1UL> *first_00;
  FixedArray<char,_1UL> *rest_1_00;
  StringTree *rest_local_1;
  FixedArray<char,_1UL> *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = (long)pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  first_00 = fwd<kj::FixedArray<char,1ul>>(rest);
  pSVar3 = fwd<kj::StringTree>(rest_1);
  rest_1_00 = fwd<kj::FixedArray<char,1ul>>(rest_2);
  fill<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (this,pos,branchIndex + 1,first_00,pSVar3,rest_1_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}